

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
ethash_params_init_genesis_check::test_method(ethash_params_init_genesis_check *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_360;
  uint local_34c;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]> local_348;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>
  local_328;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
  local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>
  local_2e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>
  local_2c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_2a8;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  uint local_23c;
  unsigned_long local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> local_230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>
  local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
  local_1f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>
  local_1d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>,_unsigned_int,_const_unsigned_int_&>
  local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_190;
  assertion_result local_170;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  uint local_128 [4];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>
  local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
  local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>
  local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>
  local_98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
  local_78;
  assertion_result local_58;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  uint64_t local_20;
  uint64_t cache_size;
  uint64_t full_size;
  ethash_params_init_genesis_check *this_local;
  
  full_size = (uint64_t)this;
  cache_size = ethash_get_datasize(0);
  local_20 = ethash_get_cachesize(0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_30,0xa0,&local_40);
    boost::test_tools::assertion_result::assertion_result(&local_58,cache_size < 0x40000000);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_118,plVar3,(char (*) [13])"\nfull size: ");
    boost::unit_test::operator<<(&local_f8,&local_118,&cache_size);
    boost::unit_test::operator<<(&local_d8,&local_f8,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<
              (&local_b8,&local_d8,(char (*) [34])"should be less than or equal to: ");
    local_128[0] = 0x40000000;
    boost::unit_test::operator<<(&local_98,&local_b8,local_128);
    boost::unit_test::operator<<(&local_78,&local_98,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_58,&local_78,&local_138,0xa0,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_78);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_98);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>
    ::~lazy_ostream_impl(&local_b8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_d8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>,_unsigned_long,_const_unsigned_long_&>
    ::~lazy_ostream_impl(&local_f8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[13],_const_char_(&)[13]>::
    ~lazy_ostream_impl(&local_118);
    boost::test_tools::assertion_result::~assertion_result(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_158);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_148,0xa3,&local_158);
    boost::test_tools::assertion_result::assertion_result
              (&local_170,0x3fffffff < cache_size + 0xa00);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar3,(char (*) [28])"\nfull size + 20*MIX_BYTES: ");
    local_238 = cache_size + 0xa00;
    boost::unit_test::operator<<(&local_210,&local_230,&local_238);
    boost::unit_test::operator<<(&local_1f0,&local_210,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<
              (&local_1d0,&local_1f0,(char (*) [37])"should be greater than or equal to: ");
    local_23c = 0x40000000;
    boost::unit_test::operator<<(&local_1b0,&local_1d0,&local_23c);
    boost::unit_test::operator<<(&local_190,&local_1b0,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_170,&local_190,&local_250,0xa3,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_190);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_1b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[37],_const_char_(&)[37]>
    ::~lazy_ostream_impl(&local_1d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_1f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_unsigned_long,_const_unsigned_long_&>
    ::~lazy_ostream_impl(&local_210);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl(&local_230);
    boost::test_tools::assertion_result::~assertion_result(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0xa6,&local_270);
    boost::test_tools::assertion_result::assertion_result(&local_288,local_20 < 0x2000000);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_348,plVar3,(char (*) [14])"\ncache size: ");
    boost::unit_test::operator<<(&local_328,&local_348,&local_20);
    boost::unit_test::operator<<(&local_308,&local_328,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<
              (&local_2e8,&local_308,(char (*) [34])"should be less than or equal to: ");
    local_34c = 0x2000000;
    boost::unit_test::operator<<(&local_2c8,&local_2e8,&local_34c);
    boost::unit_test::operator<<(&local_2a8,&local_2c8,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_288,&local_2a8,&local_360,0xa6,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_2a8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>,_unsigned_int,_const_unsigned_int_&>
    ::~lazy_ostream_impl(&local_2c8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>,_char[34],_const_char_(&)[34]>
    ::~lazy_ostream_impl(&local_2e8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_308);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>,_unsigned_long,_const_unsigned_long_&>
    ::~lazy_ostream_impl(&local_328);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>::
    ~lazy_ostream_impl(&local_348);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_params_init_genesis_check) {
	uint64_t full_size = ethash_get_datasize(0);
	uint64_t cache_size = ethash_get_cachesize(0);
	BOOST_REQUIRE_MESSAGE(full_size < ETHASH_DATASET_BYTES_INIT,
			"\nfull size: " << full_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(full_size + 20 * ETHASH_MIX_BYTES >= ETHASH_DATASET_BYTES_INIT,
			"\nfull size + 20*MIX_BYTES: " << full_size + 20 * ETHASH_MIX_BYTES << "\n"
					<< "should be greater than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(cache_size < ETHASH_DATASET_BYTES_INIT / 32,
			"\ncache size: " << cache_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT / 32 << "\n");
}